

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

void __thiscall
ncnn::ConvolutionDepthWise::make_padding
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *bottom_blob_bordered,int _kernel_w,
          int _kernel_h,Option *opt)

{
  int *piVar1;
  int in_ECX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int in_R8D;
  void *in_R9;
  Option opt_b_2;
  int hpad_1;
  int wpad_1;
  Option opt_b_1;
  int hpad;
  int wpad;
  Option opt_b;
  int kernel_extent_h;
  int kernel_extent_w;
  int h;
  int w;
  float v;
  undefined8 *puVar2;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  Mat *in_stack_fffffffffffffec8;
  Mat *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffee0;
  Option *in_stack_fffffffffffffee8;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  int local_b8;
  int local_b4;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  void *local_60;
  int local_38;
  undefined4 local_34;
  undefined8 *local_30;
  undefined8 *local_20;
  int local_18;
  undefined4 local_14;
  void *local_8;
  
  local_64 = *(int *)((long)in_RSI + 0x2c);
  local_68 = *(int *)(in_RSI + 6);
  local_6c = *(int *)(in_RDI + 0xdc) * (in_ECX + -1) + 1;
  local_70 = *(int *)(in_RDI + 0xe0) * (in_R8D + -1) + 1;
  local_60 = in_R9;
  local_20 = in_RDX;
  if (in_RDX != in_RSI) {
    if (in_RSI[1] != 0) {
      piVar1 = (int *)in_RSI[1];
      local_34 = 1;
      LOCK();
      local_38 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    puVar2 = in_RDX;
    local_30 = in_RSI;
    if (in_RDX[1] != 0) {
      piVar1 = (int *)in_RDX[1];
      local_14 = 0xffffffff;
      LOCK();
      local_18 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_18 == 1) {
        if (in_RDX[4] == 0) {
          local_8 = (void *)*in_RDX;
          if (local_8 != (void *)0x0) {
            free(local_8);
          }
        }
        else {
          (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
        }
      }
    }
    *in_RDX = 0;
    in_RDX[2] = 0;
    *(undefined4 *)(in_RDX + 3) = 0;
    *(undefined4 *)(in_RDX + 5) = 0;
    *(undefined4 *)((long)in_RDX + 0x2c) = 0;
    *(undefined4 *)(in_RDX + 6) = 0;
    *(undefined4 *)((long)in_RDX + 0x34) = 0;
    *(undefined4 *)(in_RDX + 7) = 0;
    in_RDX[8] = 0;
    in_RDX[1] = 0;
    *puVar2 = *local_30;
    puVar2[1] = local_30[1];
    puVar2[2] = local_30[2];
    *(undefined4 *)(puVar2 + 3) = *(undefined4 *)(local_30 + 3);
    puVar2[4] = local_30[4];
    *(undefined4 *)(puVar2 + 5) = *(undefined4 *)(local_30 + 5);
    *(undefined4 *)((long)puVar2 + 0x2c) = *(undefined4 *)((long)local_30 + 0x2c);
    *(undefined4 *)(puVar2 + 6) = *(undefined4 *)(local_30 + 6);
    *(undefined4 *)((long)puVar2 + 0x34) = *(undefined4 *)((long)local_30 + 0x34);
    *(undefined4 *)(puVar2 + 7) = *(undefined4 *)(local_30 + 7);
    puVar2[8] = local_30[8];
    local_20 = puVar2;
  }
  v = (float)((ulong)in_RDI >> 0x20);
  if ((((*(int *)(in_RDI + 0xec) < 1) && (*(int *)(in_RDI + 0xf0) < 1)) &&
      (*(int *)(in_RDI + 0xf4) < 1)) && (*(int *)(in_RDI + 0xf8) < 1)) {
    if (((*(int *)(in_RDI + 0xec) == -0xe9) && (*(int *)(in_RDI + 0xf0) == -0xe9)) &&
       ((*(int *)(in_RDI + 0xf4) == -0xe9 && (*(int *)(in_RDI + 0xf8) == -0xe9)))) {
      local_b4 = (local_6c + ((local_64 + -1) / *(int *)(in_RDI + 0xe4)) * *(int *)(in_RDI + 0xe4))
                 - local_64;
      local_b8 = (local_70 + ((local_68 + -1) / *(int *)(in_RDI + 0xe8)) * *(int *)(in_RDI + 0xe8))
                 - local_68;
      if ((0 < local_b4) || (0 < local_b8)) {
        memcpy(local_f8,local_60,0x40);
        local_f0 = *(undefined8 *)((long)local_60 + 0x10);
        copy_make_border(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                         (int)((ulong)local_20 >> 0x20),(int)local_20,in_stack_fffffffffffffee0,v,
                         in_stack_fffffffffffffee8);
      }
    }
    else if (((*(int *)(in_RDI + 0xec) == -0xea) && (*(int *)(in_RDI + 0xf0) == -0xea)) &&
            ((*(int *)(in_RDI + 0xf4) == -0xea &&
             ((*(int *)(in_RDI + 0xf8) == -0xea &&
              ((0 < (local_6c +
                    ((local_64 + -1) / *(int *)(in_RDI + 0xe4)) * *(int *)(in_RDI + 0xe4)) -
                    local_64 ||
               (0 < (local_70 +
                    ((local_68 + -1) / *(int *)(in_RDI + 0xe8)) * *(int *)(in_RDI + 0xe8)) -
                    local_68)))))))) {
      memcpy(&stack0xfffffffffffffec0,local_60,0x40);
      copy_make_border(in_stack_fffffffffffffed0,*(Mat **)((long)local_60 + 0x10),
                       in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                       (int)((ulong)local_20 >> 0x20),(int)local_20,in_stack_fffffffffffffee0,v,
                       in_stack_fffffffffffffee8);
    }
  }
  else {
    memcpy(local_b0,local_60,0x40);
    local_a8 = *(undefined8 *)((long)local_60 + 0x10);
    copy_make_border(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                     in_stack_fffffffffffffec0,(int)((ulong)local_20 >> 0x20),(int)local_20,
                     in_stack_fffffffffffffee0,v,in_stack_fffffffffffffee8);
  }
  return;
}

Assistant:

void ConvolutionDepthWise::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, int _kernel_w, int _kernel_h, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}